

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fTextureBorderClampTests.cpp
# Opt level: O0

bool deqp::gles31::Functional::anon_unknown_1::isCoreFilterableFormat
               (deUint32 format,DepthStencilMode mode)

{
  bool bVar1;
  bool bVar2;
  bool bVar3;
  bool bVar4;
  bool isStencil;
  bool isDepth;
  bool isCompressed;
  bool isUnsizedColorFormat;
  bool isLuminanceOrAlpha;
  DepthStencilMode mode_local;
  deUint32 format_local;
  
  bVar4 = true;
  if ((format != 0x1909) && (bVar4 = true, format != 0x1906)) {
    bVar4 = format == 0x190a;
  }
  bVar1 = glu::isCompressedFormat(format);
  bVar2 = isDepthFormat(format,mode);
  bVar3 = isStencilFormat(format,mode);
  if (((bVar4) || (format == 0x80e1)) || (bVar1)) {
    mode_local._3_1_ = 1;
  }
  else if ((bVar3) || (bVar2)) {
    mode_local._3_1_ = MODE_DEPTH >> 0x18;
  }
  else {
    mode_local._3_1_ = glu::isGLInternalColorFormatFilterable(format);
  }
  return (bool)mode_local._3_1_;
}

Assistant:

bool isCoreFilterableFormat (deUint32 format, tcu::Sampler::DepthStencilMode mode)
{
	const bool	isLuminanceOrAlpha		= (format == GL_LUMINANCE || format == GL_ALPHA || format == GL_LUMINANCE_ALPHA); // special case for luminance/alpha
	const bool	isUnsizedColorFormat	= (format == GL_BGRA);
	const bool	isCompressed			= glu::isCompressedFormat(format);
	const bool	isDepth					= isDepthFormat(format, mode);
	const bool	isStencil				= isStencilFormat(format, mode);

	// special cases
	if (isLuminanceOrAlpha || isUnsizedColorFormat || isCompressed)
		return true;
	if (isStencil || isDepth)
		return false;

	// color case
	return glu::isGLInternalColorFormatFilterable(format);
}